

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

PaError Pa_Initialize(void)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  PaUtilHostApiRepresentation *pPVar4;
  long lVar5;
  PaError PVar6;
  PaUtilHostApiRepresentation **ppPVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  
  if (initializationCount_ != 0) {
    initializationCount_ = initializationCount_ + 1;
    return 0;
  }
  PaUtil_InitializeClock();
  uVar9 = 0xffffffffffffffff;
  lVar11 = -0x100000000;
  do {
    lVar11 = lVar11 + 0x100000000;
    lVar5 = uVar9 + 1;
    uVar9 = uVar9 + 1;
  } while (paHostApiInitializers[lVar5] != (PaUtilHostApiInitializer *)0x0);
  ppPVar7 = (PaUtilHostApiRepresentation **)PaUtil_AllocateMemory(lVar11 >> 0x1d);
  hostApis_ = ppPVar7;
  if (ppPVar7 == (PaUtilHostApiRepresentation **)0x0) {
    PVar6 = -0x2708;
LAB_001089a1:
    TerminateHostApis();
    return PVar6;
  }
  uVar8 = 0;
  hostApisCount_ = 0;
  defaultHostApiIndex_ = -1;
  deviceCount_ = 0;
  if (uVar9 != 0) {
    uVar12 = 1;
    if (1 < (int)uVar9) {
      uVar12 = uVar9 & 0xffffffff;
    }
    uVar9 = 0;
    iVar10 = 0;
    do {
      ppPVar7[(int)uVar8] = (PaUtilHostApiRepresentation *)0x0;
      PVar6 = (*paHostApiInitializers[uVar9])(ppPVar7 + (int)uVar8,(int)uVar8);
      ppPVar7 = hostApis_;
      if (PVar6 != 0) goto LAB_001089a1;
      uVar8 = (ulong)hostApisCount_;
      pPVar4 = hostApis_[uVar8];
      if (pPVar4 != (PaUtilHostApiRepresentation *)0x0) {
        iVar1 = (pPVar4->info).deviceCount;
        uVar2 = (pPVar4->info).defaultInputDevice;
        if (iVar1 <= (int)uVar2) {
          __assert_fail("hostApi->info.defaultInputDevice < hostApi->info.deviceCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/common/pa_front.c"
                        ,0xeb,"PaError InitializeHostApis(void)");
        }
        uVar3 = (pPVar4->info).defaultOutputDevice;
        if (iVar1 <= (int)uVar3) {
          __assert_fail("hostApi->info.defaultOutputDevice < hostApi->info.deviceCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/common/pa_front.c"
                        ,0xec,"PaError InitializeHostApis(void)");
        }
        if (defaultHostApiIndex_ == -1) {
          if ((uVar3 & uVar2) != 0xffffffff) {
            defaultHostApiIndex_ = hostApisCount_;
            goto LAB_0010893a;
          }
          (pPVar4->privatePaFrontInfo).baseDeviceIndex = (long)iVar10;
        }
        else {
LAB_0010893a:
          (pPVar4->privatePaFrontInfo).baseDeviceIndex = (long)iVar10;
          if (uVar2 != 0xffffffff) {
            (pPVar4->info).defaultInputDevice = uVar2 + iVar10;
          }
          if (uVar3 != 0xffffffff) {
            (pPVar4->info).defaultOutputDevice = uVar3 + iVar10;
          }
        }
        deviceCount_ = deviceCount_ + iVar1;
        iVar10 = iVar10 + iVar1;
        hostApisCount_ = hostApisCount_ + 1;
        uVar8 = (ulong)(uint)hostApisCount_;
      }
      uVar9 = uVar9 + 1;
    } while (uVar12 != uVar9);
    if (defaultHostApiIndex_ != -1) goto LAB_0010898e;
  }
  defaultHostApiIndex_ = 0;
LAB_0010898e:
  initializationCount_ = initializationCount_ + 1;
  return 0;
}

Assistant:

PaError Pa_Initialize( void )
{
    PaError result;

    PA_LOGAPI_ENTER( "Pa_Initialize" );

    if( PA_IS_INITIALISED_ )
    {
        ++initializationCount_;
        result = paNoError;
    }
    else
    {
        PA_VALIDATE_TYPE_SIZES;
        PA_VALIDATE_ENDIANNESS;
        
        PaUtil_InitializeClock();
        PaUtil_ResetTraceMessages();

        result = InitializeHostApis();
        if( result == paNoError )
            ++initializationCount_;
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_Initialize", result );

    return result;
}